

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::RpcCallContext::~RpcCallContext(RpcCallContext *this)

{
  bool bVar1;
  Type local_18;
  RpcCallContext *local_10;
  RpcCallContext *this_local;
  
  local_10 = this;
  bVar1 = isFirstResponder(this);
  if (bVar1) {
    local_18.this = this;
    kj::UnwindDetector::
    catchExceptionsIfUnwinding<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext::~RpcCallContext()::_lambda()_1_>
              (&this->unwindDetector,&local_18);
  }
  kj::Own<kj::PromiseFulfiller<void>_>::~Own(&this->cancelFulfiller);
  kj::Maybe<kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_>_>::~Maybe
            (&this->tailCallPipelineFulfiller);
  kj::Maybe<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcServerResponse>_>::
  ~Maybe(&this->response);
  ReaderCapabilityTable::~ReaderCapabilityTable(&this->paramsCapTable);
  kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>::~Maybe(&this->request);
  kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>::~Own(&this->connectionState);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~RpcCallContext() noexcept(false) {
      if (isFirstResponder()) {
        // We haven't sent a return yet, so we must have been canceled.  Send a cancellation return.
        unwindDetector.catchExceptionsIfUnwinding([&]() {
          // Don't send anything if the connection is broken.
          if (connectionState->connection.is<Connected>()) {
            auto message = connectionState->connection.get<Connected>()->newOutgoingMessage(
                messageSizeHint<rpc::Return>() + sizeInWords<rpc::Payload>());
            auto builder = message->getBody().initAs<rpc::Message>().initReturn();

            builder.setAnswerId(answerId);
            builder.setReleaseParamCaps(false);

            if (redirectResults) {
              // The reason we haven't sent a return is because the results were sent somewhere
              // else.
              builder.setResultsSentElsewhere();
            } else {
              builder.setCanceled();
            }

            message->send();
          }

          cleanupAnswerTable(nullptr, true);
        });
      }
    }